

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O3

void __thiscall Highs::deleteColsInterface(Highs *this,HighsIndexCollection *index_collection)

{
  vector<double,_std::allocator<double>_> *scale;
  uint entry_dim;
  int iVar1;
  pointer piVar2;
  undefined8 in_RAX;
  HighsInt col;
  ulong uVar3;
  HighsInt new_col;
  uint uVar4;
  uint uVar5;
  bool deleted_nonbasic;
  bool deleted_basic;
  bool local_22;
  bool local_21;
  
  local_21 = SUB81((ulong)in_RAX >> 0x38,0);
  HighsSparseMatrix::ensureColwise(&(this->model_).lp_.a_matrix_);
  entry_dim = (this->model_).lp_.num_col_;
  HighsLp::deleteCols(&(this->model_).lp_,index_collection);
  HighsHessian::deleteCols(&(this->model_).hessian_,index_collection);
  if ((this->model_).lp_.num_col_ == entry_dim) {
    return;
  }
  this->model_status_ = kMin;
  if ((this->basis_).useful == true) {
    deleteBasisEntries(&(this->basis_).col_status,&local_21,&local_22,index_collection,entry_dim);
    if (local_21 == true) {
      (this->basis_).valid = false;
    }
  }
  if ((this->model_).lp_.scale_.has_scaling == true) {
    scale = &(this->model_).lp_.scale_.col;
    deleteScale(scale,index_collection);
    std::vector<double,_std::allocator<double>_>::resize(scale,(long)(this->model_).lp_.num_col_);
    (this->model_).lp_.scale_.num_col = (this->model_).lp_.num_col_;
  }
  invalidateModelStatusSolutionAndInfo(this);
  HEkk::deleteCols(&this->ekk_instance_,index_collection);
  if ((0 < (int)entry_dim & index_collection->is_mask_) == 1) {
    piVar2 = (index_collection->mask_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = 0;
    uVar4 = 0;
    do {
      iVar1 = piVar2[uVar3];
      uVar5 = -(uint)(iVar1 != 0) | uVar4;
      uVar4 = uVar4 + (iVar1 == 0);
      piVar2[uVar3] = uVar5;
      uVar3 = uVar3 + 1;
    } while (entry_dim != uVar3);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)&(this->model_).lp_.col_hash_);
  return;
}

Assistant:

void Highs::deleteColsInterface(HighsIndexCollection& index_collection) {
  HighsLp& lp = model_.lp_;
  HighsBasis& basis = basis_;
  lp.ensureColwise();

  // Keep a copy of the original number of columns to check whether
  // any columns have been removed, and if there is mask to be updated
  HighsInt original_num_col = lp.num_col_;

  lp.deleteCols(index_collection);
  model_.hessian_.deleteCols(index_collection);
  // Bail out if no columns were actually deleted
  if (lp.num_col_ == original_num_col) return;

  assert(lp.num_col_ < original_num_col);

  // Nontrivial deletion so reset the model_status and update any
  // Highs basis
  model_status_ = HighsModelStatus::kNotset;
  if (basis_.useful) {
    assert(basis_.col_status.size() == static_cast<size_t>(original_num_col));
    // Have a full set of column basis status values, so maintain
    // them, and only invalidate the basis if a basic column has been
    // deleted
    deleteBasisCols(basis_, index_collection, original_num_col);
  } else {
    assert(!basis.valid);
  }

  if (lp.scale_.has_scaling) {
    deleteScale(lp.scale_.col, index_collection);
    lp.scale_.col.resize(lp.num_col_);
    lp.scale_.num_col = lp.num_col_;
  }
  // Deduce the consequences of deleting columns
  invalidateModelStatusSolutionAndInfo();

  // Determine any implications for simplex data
  ekk_instance_.deleteCols(index_collection);

  if (index_collection.is_mask_) {
    // Set the mask values to indicate the new index value of the
    // remaining columns
    HighsInt new_col = 0;
    for (HighsInt col = 0; col < original_num_col; col++) {
      if (!index_collection.mask_[col]) {
        index_collection.mask_[col] = new_col;
        new_col++;
      } else {
        index_collection.mask_[col] = -1;
      }
    }
    assert(new_col == lp.num_col_);
  }
  assert(lpDimensionsOk("deleteCols", lp, options_.log_options));
  lp.col_hash_.name2index.clear();
}